

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O2

bool __thiscall helics::MultiBroker::brokerConnect(MultiBroker *this)

{
  CommsInterface *pCVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Alloc_hider _Var4;
  int iVar5;
  Option *pOVar6;
  milliseconds mVar7;
  CoreType CVar8;
  CoreType type;
  sockaddr *__addr;
  sockaddr *__addr_00;
  ushort uVar9;
  bool bVar10;
  string_view localAddress;
  string_view name;
  string_view name_00;
  allocator<char> local_3a1;
  MultiBroker *local_3a0;
  shared_ptr<helics::helicsCLI11App> app;
  CoreType *local_380;
  shared_ptr<CLI::Config> local_370 [2];
  vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
  *local_350;
  string *local_348;
  BrokerBase *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  string localConfigString;
  ostringstream oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  undefined1 local_2d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined8 local_238;
  int local_230;
  undefined7 local_22c;
  undefined4 uStack_225;
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  InterfaceTypes local_200;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_d0;
  string local_b0;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_90;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  string local_50;
  
  app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 "--config=\'",&this->configFile);
  std::operator+(&localConfigString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,'\'');
  std::__cxx11::string::~string((string *)&oss);
  local_3a0 = this;
  if ((this->configFile)._M_string_length == 0) {
    if (this->type == MULTI) {
      this->type = DEFAULT;
    }
LAB_00195dce:
    local_380 = &this->type;
    if ((this->netInfo).brokerAddress._M_string_length == 0 &&
        (this->netInfo).brokerName._M_string_length == 0) {
      CoreBroker::setAsRoot(&this->super_CoreBroker);
    }
    CommFactory::create((CommFactory *)&oss,*local_380);
    _Var4._M_p = _oss;
    _oss = (pointer)0x0;
    pCVar1 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    (this->masterComm)._M_t.
    super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>._M_t
    .super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>.
    super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl =
         (CommsInterface *)_Var4._M_p;
    if ((pCVar1 != (CommsInterface *)0x0) &&
       ((*pCVar1->_vptr_CommsInterface[1])(), (CommsInterface *)_oss != (CommsInterface *)0x0)) {
      (**(code **)(*(long *)_oss + 8))();
    }
    local_70._8_8_ = 0;
    local_58 = CLI::std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:113:37)>
               ::_M_invoke;
    local_60 = CLI::std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:113:37)>
               ::_M_manager;
    local_70._M_unused._M_object = this;
    CommsInterface::setCallback
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
               (function<void_(helics::ActionMessage_&&)> *)&local_70);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_70);
    pCVar1 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    BrokerBase::getLoggingCallback(&(this->super_CoreBroker).super_BrokerBase);
    CommsInterface::setLoggingCallback(pCVar1,&local_d0);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_d0);
    CommsInterface::setName
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
               (string *)&(this->super_CoreBroker).super_BrokerBase.identifier);
    pCVar1 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    (*pCVar1->_vptr_CommsInterface[2])(pCVar1,&this->netInfo);
    CVar8 = 1000000;
    mVar7.__r = (this->super_CoreBroker).super_BrokerBase.networkTimeout.internalTimeCode / 1000000;
    CommsInterface::setTimeout
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,mVar7);
    iVar5 = CommsInterface::connect
                      ((this->masterComm)._M_t.
                       super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
                       .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
                       (int)mVar7.__r,__addr,CVar8);
    if ((char)iVar5 == '\0') {
      bVar10 = false;
      goto LAB_00196611;
    }
    name._M_str._0_4_ = this->type;
    name._M_len = (size_t)(this->super_CoreBroker).super_BrokerBase.identifier._M_dataplus._M_p;
    name._M_str._4_4_ = 0;
    BrokerFactory::addAssociatedBrokerType
              ((BrokerFactory *)
               (this->super_CoreBroker).super_BrokerBase.identifier._M_string_length,name,CVar8);
  }
  else {
    localAddress._M_str = (char *)0x0;
    localAddress._M_len = (size_t)&this->netInfo;
    NetworkBrokerData::commandLineParser((NetworkBrokerData *)&oss,localAddress,true);
    CLI::std::__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2> *)&oss);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0);
    helicsCLI11App::addTypeOption
              (app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               true);
    ((app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_App)
    .allow_config_extras_ = error;
    if (this->type != MULTI) goto LAB_00195dce;
    std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>(local_370);
    peVar3 = local_370[0].super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&oss,"master",&local_3a1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &peVar3[1].items.
                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
                super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_370[0].super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    peVar2 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coreType =
         this->type;
    std::__cxx11::string::string((string *)&local_b0,&localConfigString);
    CLI::App::parse(&peVar2->super_App,&local_b0,false);
    std::__cxx11::string::~string((string *)&local_b0);
    CVar8 = (app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            coreType;
    this->type = CVar8;
    if (CVar8 != MULTI) goto LAB_00195dce;
  }
  local_380 = &this->type;
  bVar10 = (this->configFile)._M_string_length == 0;
  if (!bVar10) {
    peVar2 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"--broker",(allocator<char> *)&oss);
    pOVar6 = CLI::App::get_option(&peVar2->super_App,&local_f0);
    CLI::App::remove_option(&peVar2->super_App,pOVar6);
    std::__cxx11::string::~string((string *)&local_f0);
    peVar2 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"--brokerport",(allocator<char> *)&oss);
    pOVar6 = CLI::App::get_option(&peVar2->super_App,&local_110);
    CLI::App::remove_option(&peVar2->super_App,pOVar6);
    std::__cxx11::string::~string((string *)&local_110);
    peVar2 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"--brokername",(allocator<char> *)&oss);
    pOVar6 = CLI::App::get_option(&peVar2->super_App,&local_130);
    CLI::App::remove_option(&peVar2->super_App,pOVar6);
    std::__cxx11::string::~string((string *)&local_130);
    peVar2 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"--brokeraddress",(allocator<char> *)&oss);
    pOVar6 = CLI::App::get_option(&peVar2->super_App,&local_150);
    CLI::App::remove_option(&peVar2->super_App,pOVar6);
    std::__cxx11::string::~string((string *)&local_150);
    peVar2 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"--autobroker",(allocator<char> *)&oss);
    pOVar6 = CLI::App::get_option(&peVar2->super_App,&local_170);
    CLI::App::remove_option(&peVar2->super_App,pOVar6);
    std::__cxx11::string::~string((string *)&local_170);
  }
  local_340 = &(this->super_CoreBroker).super_BrokerBase;
  local_348 = (string *)&(this->super_CoreBroker).super_BrokerBase.identifier;
  local_350 = (vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
               *)&this->comms;
  uVar9 = 0;
  while (!bVar10) {
    memset((CommsInterface *)local_2d8,0,0xe0);
    local_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2d8._16_8_ = local_2b8;
    local_2b8[0]._M_local_buf[0] = '\0';
    local_2b8[1]._0_8_ = local_298;
    local_298[0]._M_local_buf[0] = '\0';
    local_298[1]._0_8_ = &local_278;
    local_278._M_local_buf[0] = '\0';
    local_268._M_p = (pointer)&local_258;
    local_258._M_local_buf[0] = '\0';
    local_248 = -1;
    iStack_244 = -1;
    iStack_240 = -1;
    iStack_23c = -1;
    local_238._0_1_ = (condition_variable)0x0;
    local_238._1_7_ = 0x100000010;
    local_230 = 5;
    local_22c = 0;
    uStack_225 = 0;
    local_220._M_p = (pointer)&local_210;
    local_210._M_local_buf[0] = '\0';
    local_200 = IP;
    _oss = (pointer)local_2d8;
    NetworkBrokerData::operator=(&this->netInfo,(NetworkBrokerData *)&oss);
    NetworkBrokerData::~NetworkBrokerData((NetworkBrokerData *)&oss);
    std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>(local_370);
    peVar3 = local_370[0].super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&oss,"comms",&local_3a1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &peVar3[1].items.
                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
                super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
    *(ushort *)
     ((long)&peVar3[1].items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
             _M_impl.super__Vector_impl_data._M_start + 2) = uVar9;
    std::__cxx11::string::~string((string *)&oss);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_370[0].super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    peVar2 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coreType =
         MULTI;
    std::__cxx11::string::string((string *)&local_50,&localConfigString);
    CLI::App::parse(&peVar2->super_App,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    CVar8 = (app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            coreType;
    *local_380 = CVar8;
    if (CVar8 != MULTI) {
      CommFactory::create((CommFactory *)&oss,CVar8);
      local_338._M_unused._M_object = local_3a0;
      local_338._10_6_ = 0;
      local_338._8_2_ = uVar9;
      local_320 = CLI::std::
                  _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:144:35)>
                  ::_M_invoke;
      local_328 = CLI::std::
                  _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:144:35)>
                  ::_M_manager;
      CommsInterface::setCallback
                ((CommsInterface *)_oss,(function<void_(helics::ActionMessage_&&)> *)&local_338);
      CLI::std::_Function_base::~_Function_base((_Function_base *)&local_338);
      _Var4._M_p = _oss;
      BrokerBase::getLoggingCallback(local_340);
      CommsInterface::setLoggingCallback((CommsInterface *)_Var4._M_p,&local_90);
      CLI::std::_Function_base::~_Function_base((_Function_base *)&local_90);
      CommsInterface::setName((CommsInterface *)_oss,local_348);
      (**(code **)(*(long *)_oss + 0x10))(_oss,&this->netInfo);
      type = 1000000;
      mVar7.__r = (local_3a0->super_CoreBroker).super_BrokerBase.networkTimeout.internalTimeCode /
                  1000000;
      CommsInterface::setTimeout((CommsInterface *)_oss,mVar7);
      iVar5 = CommsInterface::connect((CommsInterface *)_oss,(int)mVar7.__r,__addr_00,type);
      std::
      vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
      ::
      emplace_back<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>
                (local_350,
                 (unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *
                 )&oss);
      if ((char)iVar5 == '\0') {
        (*(local_3a0->super_CoreBroker).super_Broker._vptr_Broker[0x21])();
      }
      else {
        name_00._M_str._0_4_ = local_3a0->type;
        name_00._M_len =
             (size_t)(local_3a0->super_CoreBroker).super_BrokerBase.identifier._M_dataplus._M_p;
        name_00._M_str._4_4_ = 0;
        BrokerFactory::addAssociatedBrokerType
                  ((BrokerFactory *)
                   (local_3a0->super_CoreBroker).super_BrokerBase.identifier._M_string_length,
                   name_00,type);
      }
      if ((CommsInterface *)_oss != (CommsInterface *)0x0) {
        (**(code **)(*(long *)_oss + 8))();
      }
      if ((char)iVar5 == '\0') break;
    }
    uVar9 = uVar9 + 1;
    bVar10 = CVar8 == MULTI;
  }
LAB_00196611:
  std::__cxx11::string::~string((string *)&localConfigString);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return bVar10;
}

Assistant:

bool MultiBroker::brokerConnect()
{
    std::shared_ptr<helicsCLI11App> app;
    const std::string localConfigString = "--config='" + configFile + '\'';
    if (!configFile.empty()) {
        app = netInfo.commandLineParser("");
        app->addTypeOption();
        app->allow_config_extras(CLI::config_extras_mode::error);
    } else if (type == CoreType::MULTI) {
        type = CoreType::DEFAULT;
    }
    try {
        if (type == CoreType::MULTI) {
            app->get_config_formatter_base()->section("master");
            app->setDefaultCoreType(type);
            app->parse(localConfigString);
            type = app->getCoreType();
        }
        if (type != CoreType::MULTI) {
            if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
                CoreBroker::setAsRoot();
            }
            masterComm = CommFactory::create(type);
            masterComm->setCallback([this](ActionMessage&& message) {
                BrokerBase::addActionMessage(std::move(message));
            });
            masterComm->setLoggingCallback(BrokerBase::getLoggingCallback());
            masterComm->setName(getIdentifier());
            masterComm->loadNetworkInfo(netInfo);
            masterComm->setTimeout(networkTimeout.to_ms());

            if (!masterComm->connect()) {
                return false;
            }
            BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
        }
        bool moreComms = (!configFile.empty());
        if (moreComms) {
            // remove options that are used to specify a broker
            app->remove_option(app->get_option("--broker"));
            app->remove_option(app->get_option("--brokerport"));
            app->remove_option(app->get_option("--brokername"));
            app->remove_option(app->get_option("--brokeraddress"));
            app->remove_option(app->get_option("--autobroker"));
        }
        uint16_t index = 0;
        while (moreComms) {
            netInfo = NetworkBrokerData();  // to reset the networkBrokerData
            app->get_config_formatter_base()->section("comms")->index(index);
            app->setDefaultCoreType(CoreType::MULTI);
            app->parse(localConfigString);
            type = app->getCoreType();
            if (type != CoreType::MULTI) {
                auto comm = CommFactory::create(type);
                comm->setCallback([this, index](ActionMessage&& message) {
                    if (message.action() == CMD_REG_BROKER) {
                        message.setExtraData(index + 1);
                    }
                    BrokerBase::addActionMessage(std::move(message));
                });
                comm->setLoggingCallback(BrokerBase::getLoggingCallback());
                comm->setName(getIdentifier());
                comm->loadNetworkInfo(netInfo);
                comm->setTimeout(networkTimeout.to_ms());

                const bool res = comm->connect();
                comms.push_back(std::move(comm));
                if (!res) {
                    brokerDisconnect();
                    return false;
                }
                BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
            } else {
                moreComms = false;
            }
            ++index;
        }
    }
    catch (const CLI::Error& e) {
        std::ostringstream oss;
        app->exit(e, oss, oss);
        sendToLogger(parent_broker_id, HELICS_LOG_LEVEL_ERROR, getIdentifier(), oss.str());
        brokerDisconnect();
        return false;
    }
    catch (...) {
        brokerDisconnect();
        return false;
    }
    return true;
}